

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs6MatchImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              bool noResult,void *stackAllocationPointer)

{
  bool bVar1;
  BOOL BVar2;
  Var pvVar3;
  RecyclableObject *result_00;
  JavascriptString *matchStr_00;
  JavascriptLibrary *pJVar4;
  ScriptContext *local_78;
  JavascriptString *matchStr;
  RecyclableObject *resultObj;
  Var result;
  JavascriptArray *arrayResult;
  bool unicode;
  PCWSTR varName;
  void *stackAllocationPointer_local;
  bool noResult_local;
  JavascriptString *input_local;
  RecyclableObject *thisObj_local;
  ScriptContext *scriptContext_local;
  
  bVar1 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar1) {
    bVar1 = JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    pvVar3 = TaggedInt::ToVarUnchecked(0);
    JavascriptRegExp::SetLastIndexProperty(thisObj,pvVar3,scriptContext);
    result = (Var)0x0;
    while( true ) {
      pvVar3 = JavascriptRegExp::CallExec
                         (thisObj,input,L"RegExp.prototype[Symbol.match]",scriptContext);
      BVar2 = Js::JavascriptOperators::IsNull(pvVar3);
      if (BVar2 != 0) break;
      result_00 = ExecResultToRecyclableObject(pvVar3);
      matchStr_00 = GetMatchStrFromResult(result_00,scriptContext);
      if (result == (Var)0x0) {
        pJVar4 = ScriptContext::GetLibrary(scriptContext);
        result = JavascriptLibrary::CreateArray(pJVar4);
      }
      Js::JavascriptArray::DirectAppendItem((JavascriptArray *)result,matchStr_00);
      AdvanceLastIndex(thisObj,input,matchStr_00,bVar1,scriptContext);
    }
    if (result == (Var)0x0) {
      pJVar4 = ScriptContext::GetLibrary(scriptContext);
      local_78 = (ScriptContext *)
                 JavascriptLibraryBase::GetNull(&pJVar4->super_JavascriptLibraryBase);
    }
    else {
      local_78 = (ScriptContext *)result;
    }
    scriptContext_local = local_78;
  }
  else {
    scriptContext_local =
         (ScriptContext *)
         JavascriptRegExp::CallExec(thisObj,input,L"RegExp.prototype[Symbol.match]",scriptContext);
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::RegexEs6MatchImpl(ScriptContext* scriptContext, RecyclableObject *thisObj, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        PCWSTR const varName = _u("RegExp.prototype[Symbol.match]");

        if (!JavascriptRegExp::GetGlobalProperty(thisObj, scriptContext))
        {
            return JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
        }
        else
        {
            bool unicode = JavascriptRegExp::GetUnicodeProperty(thisObj, scriptContext);

            JavascriptRegExp::SetLastIndexProperty(thisObj, TaggedInt::ToVarUnchecked(0), scriptContext);

            JavascriptArray* arrayResult = nullptr;

            do
            {
                Var result = JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
                if (JavascriptOperators::IsNull(result))
                {
                    break;
                }

                RecyclableObject* resultObj = ExecResultToRecyclableObject(result);
                JavascriptString* matchStr = GetMatchStrFromResult(resultObj, scriptContext);

                if (arrayResult == nullptr)
                {
                    arrayResult = scriptContext->GetLibrary()->CreateArray();
                }

                arrayResult->DirectAppendItem(matchStr);

                AdvanceLastIndex(thisObj, input, matchStr, unicode, scriptContext);
            }
            while (true);

            return arrayResult != nullptr
                ? arrayResult
                : scriptContext->GetLibrary()->GetNull();
        }
    }